

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::PrimitiveFieldGenerator
          (PrimitiveFieldGenerator *this,FieldDescriptor *descriptor,int presenceIndex,
          Options *options)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  FieldDescriptor FVar1;
  bool bVar2;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar3;
  string property_name;
  string local_f8 [32];
  undefined1 local_d8 [32];
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  FieldGeneratorBase::FieldGeneratorBase
            (&this->super_FieldGeneratorBase,descriptor,presenceIndex,options);
  (this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__PrimitiveOneofFieldGenerator_004a8628;
  FVar1 = descriptor[2];
  if (FVar1 == (FieldDescriptor)0x9) {
    this->is_value_type = false;
  }
  else {
    this->is_value_type = FVar1 != (FieldDescriptor)0xc;
    if (FVar1 != (FieldDescriptor)0xc) {
      return;
    }
  }
  bVar2 = SupportsPresenceApi((this->super_FieldGeneratorBase).descriptor_);
  if (!bVar2) {
    this_00 = &(this->super_FieldGeneratorBase).variables_;
    pbVar3 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[14],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)this_00,(key_arg<char[14]> *)0x37980f);
    std::__cxx11::string::string(local_f8,(string *)pbVar3);
    local_88.piece_ = absl::lts_20240722::NullSafeStringView(".Length != 0");
    absl::lts_20240722::StrCat_abi_cxx11_(&local_b8,&local_58);
    pbVar3 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[19],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)this_00,(key_arg<char[19]> *)0x379770);
    std::__cxx11::string::operator=((string *)pbVar3,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    local_58.piece_ = absl::lts_20240722::NullSafeStringView("other.");
    local_b8.piece_ = absl::lts_20240722::NullSafeStringView(".Length != 0");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_d8,&local_58,&local_88);
    pbVar3 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[25],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)this_00,(key_arg<char[25]> *)"other_has_property_check");
    std::__cxx11::string::operator=((string *)pbVar3,(string *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string(local_f8);
  }
  return;
}

Assistant:

PrimitiveFieldGenerator::PrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, int presenceIndex, const Options *options)
    : FieldGeneratorBase(descriptor, presenceIndex, options) {
  // TODO: Make this cleaner...
  is_value_type = descriptor->type() != FieldDescriptor::TYPE_STRING
      && descriptor->type() != FieldDescriptor::TYPE_BYTES;
  if (!is_value_type && !SupportsPresenceApi(descriptor_)) {
    std::string property_name = variables_["property_name"];
    variables_["has_property_check"] =
        absl::StrCat(property_name, ".Length != 0");
    variables_["other_has_property_check"] =
        absl::StrCat("other.", property_name, ".Length != 0");
  }
}